

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O3

size_t __thiscall ON_WindowsBitmap::SizeofImage(ON_WindowsBitmap *this)

{
  ON_WindowsBITMAPINFO *pOVar1;
  ulong uVar2;
  
  pOVar1 = this->m_bmi;
  if (pOVar1 == (ON_WindowsBITMAPINFO *)0x0) {
    return 0;
  }
  uVar2 = (ulong)(pOVar1->bmiHeader).biSizeImage;
  if (uVar2 != 0) {
    return uVar2;
  }
  return (long)(pOVar1->bmiHeader).biHeight *
         (long)(int)((int)((uint)(pOVar1->bmiHeader).biBitCount * (pOVar1->bmiHeader).biWidth + 0x1f
                          ) >> 3 & 0xfffffffc);
}

Assistant:

size_t ON_WindowsBitmap::SizeofImage() const
{
  size_t sizeImage = 0;
  if ( nullptr != m_bmi ) 
  {
    sizeImage = m_bmi->bmiHeader.biSizeImage;
    if (0 == sizeImage)
    {
      const size_t w = ((((m_bmi->bmiHeader.biWidth * m_bmi->bmiHeader.biBitCount) + 31) & ~31) >> 3);
      const size_t h = m_bmi->bmiHeader.biHeight;
      sizeImage = w*h;
    }
  }
  return sizeImage;
}